

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-clientsocket.c
# Opt level: O0

int luaopen_clientsocket(lua_State *L)

{
  pthread_t local_88;
  pthread_t pid;
  queue_conflict *q;
  luaL_Reg l [6];
  lua_State *L_local;
  
  luaL_checkversion_(L,503.0,0x88);
  memcpy(&q,&DAT_00184a00,0x60);
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,5);
  luaL_setfuncs(L,(luaL_Reg *)&q,0);
  pid = (pthread_t)lua_newuserdata(L,0x2030);
  memset((void *)pid,0,0x2030);
  pthread_mutex_init((pthread_mutex_t *)pid,(pthread_mutexattr_t *)0x0);
  lua_pushcclosure(L,lreadstdin,1);
  lua_setfield(L,-2,"readstdin");
  pthread_create(&local_88,(pthread_attr_t *)0x0,readline_stdin,(void *)pid);
  return 1;
}

Assistant:

int
luaopen_clientsocket(lua_State *L) {
	luaL_checkversion(L);
	luaL_Reg l[] = {
		{ "connect", lconnect },
		{ "recv", lrecv },
		{ "send", lsend },
		{ "close", lclose },
		{ "usleep", lusleep },
		{ NULL, NULL },
	};
	luaL_newlib(L, l);

	struct queue * q = lua_newuserdata(L, sizeof(*q));
	memset(q, 0, sizeof(*q));
	pthread_mutex_init(&q->lock, NULL);
	lua_pushcclosure(L, lreadstdin, 1);
	lua_setfield(L, -2, "readstdin");

	pthread_t pid ;
	pthread_create(&pid, NULL, readline_stdin, q);

	return 1;
}